

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

void __thiscall QResourceFileEnginePrivate::mapUncompressed(QResourceFileEnginePrivate *this)

{
  QByteArray *this_00;
  QResourcePrivate *this_01;
  QArrayData *data;
  char *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  bool bVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->uncompressed;
  bVar4 = QByteArray::isNull(this_00);
  if (bVar4) {
    this_01 = (this->resource).d_ptr.d;
    QResourcePrivate::ensureInitialized(this_01);
    qVar5 = QResourcePrivate::uncompressedSize(this_01);
    if (0x3fff < qVar5) {
      bVar4 = mapUncompressed_sys(this);
      if (bVar4) goto LAB_00253899;
    }
    QResource::uncompressedData(&local_38,&this->resource);
    data = &((this->uncompressed).d.d)->super_QArrayData;
    pcVar1 = (this->uncompressed).d.ptr;
    (this->uncompressed).d.d = local_38.d.d;
    (this->uncompressed).d.ptr = local_38.d.ptr;
    qVar2 = (this->uncompressed).d.size;
    (this->uncompressed).d.size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
    pDVar3 = (this_00->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(this_00,(this->uncompressed).d.size,KeepSize);
    }
  }
LAB_00253899:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourceFileEnginePrivate::mapUncompressed()
{
    Q_ASSERT(resource.compressionAlgorithm() == QResource::NoCompression);
    if (!uncompressed.isNull())
        return;     // nothing to do

    if (resource.uncompressedSize() >= RemapCompressedThreshold) {
        if (mapUncompressed_sys())
            return;
    }

    uncompressed = resource.uncompressedData();
    uncompressed.detach();
}